

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  uint fChoicing;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_54 = 1;
  local_58 = 100;
  local_4c = 0;
  fChoicing = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"Csprcvh"), iVar5 = globalUtilOptind,
              iVar1 == 0x76) {
          fVerbose = fVerbose ^ 1;
        }
        if (iVar1 < 0x70) break;
        if (iVar1 == 0x70) {
          local_50 = local_50 ^ 1;
        }
        else if (iVar1 == 0x72) {
          local_4c = local_4c ^ 1;
        }
        else {
          if (iVar1 != 0x73) goto LAB_002127eb;
          local_54 = local_54 ^ 1;
        }
      }
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else {
          if (pAVar2->ntkType == ABC_NTK_STRASH) {
            pAVar2 = Abc_NtkDarFraig(pAVar2,local_58,local_54,local_50,0,local_4c,fChoicing,fVerbose
                                    );
            if (pAVar2 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar3 = "This command works only for strashed networks.\n";
        }
        iVar5 = -1;
        goto LAB_002128da;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 != 99) goto LAB_002127eb;
      fChoicing = fChoicing ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_58 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_58 < 0) {
LAB_002127eb:
      Abc_Print(-2,"usage: dfraig [-C num] [-sprcvh]\n");
      Abc_Print(-2,"\t         performs fraiging using a new method\n");
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_58);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_54 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle considering sparse functions [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_50 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle proving the miter outputs [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_4c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle speculative reduction [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (fChoicing == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle accumulation of choices [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_002128da:
      Abc_Print(iVar5,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_002127eb;
}

Assistant:

int Abc_CommandDFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nConfLimit, fDoSparse, fProve, fSpeculate, fChoicing, fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fSpeculate, int fChoicing, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nConfLimit   = 100;
    fDoSparse    = 1;
    fProve       = 0;
    fSpeculate   = 0;
    fChoicing    = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Csprcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 's':
            fDoSparse ^= 1;
            break;
        case 'p':
            fProve ^= 1;
            break;
        case 'r':
            fSpeculate ^= 1;
            break;
        case 'c':
            fChoicing ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkDarFraig( pNtk, nConfLimit, fDoSparse, fProve, 0, fSpeculate, fChoicing, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dfraig [-C num] [-sprcvh]\n" );
    Abc_Print( -2, "\t         performs fraiging using a new method\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-s     : toggle considering sparse functions [default = %s]\n", fDoSparse? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle proving the miter outputs [default = %s]\n", fProve? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle speculative reduction [default = %s]\n", fSpeculate? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle accumulation of choices [default = %s]\n", fChoicing? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}